

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

void __thiscall
dlib::
array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
::push_back(array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,member_function_pointer<void,_void,_void,_void> *item)

{
  unsigned_long uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  unsigned_long i;
  ulong uVar3;
  long lVar4;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  temp;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  local_60;
  
  uVar1 = this->max_array_size;
  iVar2 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
            _vptr_enumerable[8])();
  if (uVar1 == CONCAT44(extraout_var,iVar2)) {
    local_60.super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>.
    _vptr_enumerable = (_func_int **)&PTR__array_00338c50;
    local_60.pool._vptr_memory_manager_stateless_kernel_1 =
         (_func_int **)&PTR__memory_manager_stateless_kernel_1_00338d28;
    local_60.last_pos = (member_function_pointer<void,_void,_void,_void> *)0x0;
    local_60.array_size = 0;
    local_60.max_array_size = 0;
    local_60.array_elements = (member_function_pointer<void,_void,_void,_void> *)0x0;
    local_60.pos = (member_function_pointer<void,_void,_void,_void> *)0x0;
    local_60._at_start = true;
    iVar2 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
              _vptr_enumerable[8])(this);
    set_max_size(&local_60,CONCAT44(extraout_var_00,iVar2) * 2 + 1);
    iVar2 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
              _vptr_enumerable[8])(this);
    set_size(&local_60,CONCAT44(extraout_var_01,iVar2) + 1);
    lVar4 = 0;
    uVar3 = 0;
    while( true ) {
      iVar2 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
                _vptr_enumerable[8])(this);
      if (CONCAT44(extraout_var_02,iVar2) <= uVar3) break;
      std::swap<dlib::member_function_pointer<void,void,void,void>>
                ((member_function_pointer<void,_void,_void,_void> *)
                 ((long)&(this->array_elements->super_mfp_kernel_1_base_class<0UL>).mp_memory.mem +
                 lVar4),(member_function_pointer<void,_void,_void,_void> *)
                        ((long)&((local_60.array_elements)->super_mfp_kernel_1_base_class<0UL>).
                                mp_memory.mem + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x40;
    }
    std::swap<dlib::member_function_pointer<void,void,void,void>>
              (item,local_60.array_elements + (local_60.array_size - 1));
    swap(&local_60,this);
    ~array(&local_60);
    return;
  }
  iVar2 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
            _vptr_enumerable[8])(this);
  set_size(this,CONCAT44(extraout_var_03,iVar2) + 1);
  iVar2 = (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
            _vptr_enumerable[8])(this);
  std::swap<dlib::member_function_pointer<void,void,void,void>>
            (item,this->array_elements + CONCAT44(extraout_var_04,iVar2) + -1);
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (unsigned long i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }